

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

S2Cap * __thiscall S2CellUnion::GetCapBound(S2Cap *__return_storage_ptr__,S2CellUnion *this)

{
  pointer pSVar1;
  bool bVar2;
  int level;
  const_iterator __begin1;
  pointer pSVar3;
  const_iterator __end1;
  S2CellUnion *__range1;
  S2CellId id;
  S2Point local_d8;
  double local_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  undefined1 local_98 [8];
  VType VStack_90;
  VType local_88;
  S2Cap local_58;
  
  pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar3 == pSVar1) {
    S2Cap::S2Cap(__return_storage_ptr__);
  }
  else {
    local_d8.c_[2] = 0.0;
    local_d8.c_[0] = 0.0;
    local_d8.c_[1] = 0.0;
    for (; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
      local_58.super_S2Region._vptr_S2Region = (_func_int **)pSVar3->id_;
      local_c0 = local_d8.c_[2];
      local_a8 = local_d8.c_[0];
      dStack_a0 = local_d8.c_[1];
      level = S2CellId::level((S2CellId *)&local_58);
      local_b8 = S2Cell::AverageArea(level);
      S2CellId::ToPoint((S2Point *)local_98,(S2CellId *)&local_58);
      local_d8.c_[2] = local_c0 + local_88 * local_b8;
      local_d8.c_[0] = local_a8 + local_b8 * (double)local_98;
      local_d8.c_[1] = dStack_a0 + local_b8 * VStack_90;
    }
    local_98 = (undefined1  [8])0x0;
    VStack_90 = 0.0;
    local_88 = 0.0;
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)&local_d8,(D *)local_98);
    if (bVar2) {
      local_d8.c_[0] = 1.0;
      local_d8.c_[1] = 0.0;
      local_d8.c_[2] = 0.0;
    }
    else {
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                ((D *)local_98,(BasicVector<Vector3,_double,_3UL> *)&local_d8);
      local_d8.c_[2] = local_88;
      local_d8.c_[0] = (VType)local_98;
      local_d8.c_[1] = VStack_90;
    }
    S2Cap::FromPoint(__return_storage_ptr__,&local_d8);
    pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                  super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
      S2Cell::S2Cell((S2Cell *)local_98,(S2CellId)pSVar3->id_);
      S2Cell::GetCapBound(&local_58,(S2Cell *)local_98);
      S2Cap::AddCap(__return_storage_ptr__,&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2CellUnion::GetCapBound() const {
  // Compute the approximate centroid of the region.  This won't produce the
  // bounding cap of minimal area, but it should be close enough.
  if (cell_ids_.empty()) return S2Cap::Empty();
  S2Point centroid(0, 0, 0);
  for (S2CellId id : *this) {
    double area = S2Cell::AverageArea(id.level());
    centroid += area * id.ToPoint();
  }
  if (centroid == S2Point(0, 0, 0)) {
    centroid = S2Point(1, 0, 0);
  } else {
    centroid = centroid.Normalize();
  }

  // Use the centroid as the cap axis, and expand the cap angle so that it
  // contains the bounding caps of all the individual cells.  Note that it is
  // *not* sufficient to just bound all the cell vertices because the bounding
  // cap may be concave (i.e. cover more than one hemisphere).
  S2Cap cap = S2Cap::FromPoint(centroid);
  for (S2CellId id : *this) {
    cap.AddCap(S2Cell(id).GetCapBound());
  }
  return cap;
}